

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O1

void cert_expr_builder_add(CertExprBuilder *eb,char *wildcard)

{
  size_t sVar1;
  _Bool _Var2;
  Token TVar3;
  size_t sVar4;
  char **ppcVar5;
  char *pcVar6;
  ptrlen input;
  ptrlen pl;
  char *err;
  ptrlen toktext;
  char *local_48;
  ptrlen local_40;
  ptrlen local_30;
  
  sVar4 = strlen(wildcard);
  local_30.ptr = wildcard;
  local_30.len = sVar4;
  TVar3 = lex(&local_30,&local_40,&local_48);
  if (TVar3 != TOK_ERROR) {
    if ((((TVar3 == TOK_ATOM) && ((char *)local_40.ptr == wildcard)) && (local_40.len == sVar4)) &&
       (input.len = local_40.len, input.ptr = local_40.ptr, _Var2 = ptrlen_contains(input,":/"),
       !_Var2)) {
      ppcVar5 = (char **)safegrowarray(eb->wcs,&eb->wcsize,8,eb->nwcs,1,false);
      eb->wcs = ppcVar5;
      pl.len = sVar4;
      pl.ptr = wildcard;
      pcVar6 = mkstr(pl);
      sVar1 = eb->nwcs;
      eb->nwcs = sVar1 + 1;
      eb->wcs[sVar1] = pcVar6;
    }
    return;
  }
  safefree(local_48);
  return;
}

Assistant:

void cert_expr_builder_add(CertExprBuilder *eb, const char *wildcard)
{
    /* Check this wildcard is lexically valid as an atom */
    ptrlen orig = ptrlen_from_asciz(wildcard), pl = orig;
    ptrlen toktext;
    char *err;
    Token tok = lex(&pl, &toktext, &err);
    if (!(tok == TOK_ATOM &&
          toktext.ptr == orig.ptr &&
          toktext.len == orig.len &&
          atom_is_hostname_wc(toktext))) {
        if (tok == TOK_ERROR)
            sfree(err);
        return;
    }

    sgrowarray(eb->wcs, eb->wcsize, eb->nwcs);
    eb->wcs[eb->nwcs++] = mkstr(orig);
}